

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void bc_trie_insert(bc_trie_t *trie,char *key,void *data)

{
  char cVar1;
  bool bVar2;
  bc_trie_t *pbVar3;
  bc_trie_node_t *pbVar4;
  bc_trie_node_t *pbVar5;
  
  if (data != (void *)0x0 && (key != (char *)0x0 && trie != (bc_trie_t *)0x0)) {
    pbVar5 = (bc_trie_node_t *)0x0;
    do {
      if (trie->root == (bc_trie_node_t *)0x0) {
LAB_00109fc8:
        pbVar4 = (bc_trie_node_t *)bc_malloc(0x20);
        pbVar4->key = *key;
        pbVar4->data = (void *)0x0;
        pbVar4->next = (_bc_trie_node_t *)0x0;
        pbVar4->child = (_bc_trie_node_t *)0x0;
        if (trie->root == (bc_trie_node_t *)0x0) {
          trie->root = pbVar4;
        }
        else {
          pbVar5->child = pbVar4;
        }
      }
      else {
        pbVar3 = trie;
        if (pbVar5 != (bc_trie_node_t *)0x0) {
          if (pbVar5->child == (_bc_trie_node_t *)0x0) goto LAB_00109fc8;
          pbVar3 = (bc_trie_t *)&pbVar5->child;
        }
        pbVar4 = pbVar3->root;
        bVar2 = pbVar4 != (bc_trie_node_t *)0x0;
        if ((pbVar4 == (bc_trie_node_t *)0x0) || (pbVar4->key == *key)) {
          pbVar5 = (bc_trie_node_t *)0x0;
        }
        else {
          do {
            pbVar5 = pbVar4;
            pbVar4 = pbVar5->next;
            bVar2 = pbVar4 != (bc_trie_node_t *)0x0;
            if (pbVar4 == (bc_trie_node_t *)0x0) break;
          } while (pbVar4->key != *key);
        }
        if (pbVar5 != (bc_trie_node_t *)0x0 && !bVar2) {
          pbVar4 = (bc_trie_node_t *)bc_malloc(0x20);
          pbVar4->key = *key;
          pbVar4->data = (void *)0x0;
          pbVar4->next = (_bc_trie_node_t *)0x0;
          pbVar4->child = (_bc_trie_node_t *)0x0;
          pbVar5->next = pbVar4;
        }
      }
      cVar1 = *key;
      key = key + 1;
      pbVar5 = pbVar4;
    } while (cVar1 != '\0');
    if ((pbVar4->data != (void *)0x0) && (trie->free_func != (bc_free_func_t)0x0)) {
      (*trie->free_func)(pbVar4->data);
    }
    pbVar4->data = data;
  }
  return;
}

Assistant:

void
bc_trie_insert(bc_trie_t *trie, const char *key, void *data)
{
    if (trie == NULL || key == NULL || data == NULL)
        return;

    bc_trie_node_t *parent = NULL;
    bc_trie_node_t *previous;
    bc_trie_node_t *current;
    bc_trie_node_t *tmp;

    while (1) {

        if (trie->root == NULL || (parent != NULL && parent->child == NULL)) {
            current = bc_malloc(sizeof(bc_trie_node_t));
            current->key = *key;
            current->data = NULL;
            current->next = NULL;
            current->child = NULL;
            if (trie->root == NULL)
                trie->root = current;
            else
                parent->child = current;
            parent = current;
            goto clean;
        }

        tmp = parent == NULL ? trie->root : parent->child;
        previous = NULL;

        while (tmp != NULL && tmp->key != *key) {
            previous = tmp;
            tmp = tmp->next;
        }

        parent = tmp;

        if (previous == NULL || parent != NULL)
            goto clean;

        current = bc_malloc(sizeof(bc_trie_node_t));
        current->key = *key;
        current->data = NULL;
        current->next = NULL;
        current->child = NULL;
        previous->next = current;
        parent = current;

clean:
        if (*key == '\0') {
            if (parent->data != NULL && trie->free_func != NULL)
                trie->free_func(parent->data);
            parent->data = data;
            break;
        }
        key++;
    }
}